

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  int iVar2;
  u32 matchOther;
  uint uVar3;
  uchar *zPattern;
  uchar *zString;
  compareInfo *pInfo;
  long in_FS_OFFSET;
  uchar *zEsc;
  compareInfo local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)context->pFunc->pUserData;
  local_34.matchAll = 0xaa;
  local_34.matchOne = 0xaa;
  local_34.matchSet = 0xaa;
  local_34.noCase = 0xaa;
  iVar2 = sqlite3_value_bytes(*argv);
  if (psVar1->aLimit[8] < iVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      sqlite3_result_error(context,"LIKE or GLOB pattern too complex",-1);
      return;
    }
    goto LAB_00198268;
  }
  if (argc == 3) {
    zEsc = sqlite3_value_text(argv[2]);
    if (zEsc != (uchar *)0x0) {
      iVar2 = sqlite3Utf8CharLen((char *)zEsc,-1);
      if (iVar2 == 1) {
        matchOther = sqlite3Utf8Read(&zEsc);
        if ((matchOther == pInfo->matchAll) || (matchOther == pInfo->matchOne)) {
          local_34 = *pInfo;
          uVar3 = (uint)local_34 >> 8;
          if (matchOther == ((uint)local_34 & 0xff)) {
            local_34 = (compareInfo)((uint)local_34 & 0xffffff00);
          }
          pInfo = &local_34;
          if (matchOther == (uVar3 & 0xff)) {
            local_34.matchOne = '\0';
          }
        }
        goto LAB_001981f0;
      }
      sqlite3_result_error(context,"ESCAPE expression must be a single character",-1);
    }
  }
  else {
    matchOther = (u32)pInfo->matchSet;
LAB_001981f0:
    zPattern = sqlite3_value_text(*argv);
    zString = sqlite3_value_text(argv[1]);
    if (zPattern != (uchar *)0x0 && zString != (uchar *)0x0) {
      iVar2 = patternCompare(zPattern,zString,pInfo,matchOther);
      sqlite3_result_int(context,(uint)(iVar2 == 0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00198268:
  __stack_chk_fail();
}

Assistant:

static void likeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);
  struct compareInfo backupInfo;

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context,
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
    if( escape==pInfo->matchAll || escape==pInfo->matchOne ){
      memcpy(&backupInfo, pInfo, sizeof(backupInfo));
      pInfo = &backupInfo;
      if( escape==pInfo->matchAll ) pInfo->matchAll = 0;
      if( escape==pInfo->matchOne ) pInfo->matchOne = 0;
    }
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}